

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  TargetType TVar3;
  char *pcVar4;
  string *psVar5;
  mapped_type *pmVar6;
  bool bVar7;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string compilePdbPath;
  string pdbPath;
  key_type local_48;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)&pdbPath,"MSVC_C_ARCHITECTURE_ID",(allocator *)&local_c8);
  pcVar4 = cmMakefile::GetDefinition(this_00,&pdbPath);
  bVar7 = true;
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&compilePdbPath,"MSVC_CXX_ARCHITECTURE_ID",(allocator *)&local_a8);
    pcVar4 = cmMakefile::GetDefinition(this_00,&compilePdbPath);
    bVar7 = pcVar4 != (char *)0x0;
    std::__cxx11::string::~string((string *)&compilePdbPath);
  }
  std::__cxx11::string::~string((string *)&pdbPath);
  if (bVar7 != false) {
    pdbPath._M_dataplus._M_p = (pointer)&pdbPath.field_2;
    pdbPath._M_string_length = 0;
    compilePdbPath._M_dataplus._M_p = (pointer)&compilePdbPath.field_2;
    compilePdbPath._M_string_length = 0;
    pdbPath.field_2._M_local_buf[0] = '\0';
    compilePdbPath.field_2._M_local_buf[0] = '\0';
    TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar3 == EXECUTABLE) ||
         (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar3 == STATIC_LIBRARY)) ||
        (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar3 == SHARED_LIBRARY)) ||
       (TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar3 == MODULE_LIBRARY)) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_c8,pcVar1,psVar5);
      std::__cxx11::string::operator=((string *)&pdbPath,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::append((char *)&pdbPath);
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_c8,pcVar1,psVar5);
      std::__cxx11::string::append((string *)&pdbPath);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    TVar3 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((int)TVar3 < 5) {
      pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar5 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetCompilePDBPath(&local_c8,pcVar1,psVar5);
      std::__cxx11::string::operator=((string *)&compilePdbPath,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      if (compilePdbPath._M_string_length == 0) {
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                  (&local_a8,(this->super_cmCommonTargetGenerator).GeneratorTarget);
        std::operator+(&local_c8,&local_a8,"/");
        std::__cxx11::string::operator=((string *)&compilePdbPath,(string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    pcVar2 = this->LocalGenerator;
    ConvertToNinjaPath(&local_a8,this,&pdbPath);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_a8,SHELL);
    std::__cxx11::string::string((string *)&local_48,"TARGET_PDB",&local_c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_48);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    pcVar2 = this->LocalGenerator;
    ConvertToNinjaPath(&local_a8,this,&compilePdbPath);
    cmOutputConverter::ConvertToOutputFormat
              (&local_c8,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_a8,SHELL);
    std::__cxx11::string::string((string *)&local_48,"TARGET_COMPILE_PDB",&local_c9);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](vars,&local_48);
    std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    EnsureParentDirectoryExists(this,&pdbPath);
    EnsureParentDirectoryExists(this,&compilePdbPath);
    std::__cxx11::string::~string((string *)&compilePdbPath);
    std::__cxx11::string::~string((string *)&pdbPath);
    return bVar7;
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID"))
    {
    std::string pdbPath;
    std::string compilePdbPath;
    if(this->GeneratorTarget->GetType() == cmState::EXECUTABLE ||
       this->GeneratorTarget->GetType() == cmState::STATIC_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::SHARED_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::MODULE_LIBRARY)
      {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
      }
    if(this->GeneratorTarget->GetType() <= cmState::OBJECT_LIBRARY)
      {
      compilePdbPath =
              this->GeneratorTarget->GetCompilePDBPath(this->GetConfigName());
      if(compilePdbPath.empty())
        {
        compilePdbPath = this->GeneratorTarget->GetSupportDirectory() + "/";
        }
      }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
                          ConvertToNinjaPath(pdbPath),
                          cmLocalGenerator::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath),
        cmLocalGenerator::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
    }
  return false;
}